

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O3

void __thiscall
wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t::process
          (start_of_frame_0_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  state_base_t *psVar1;
  state_base_t *psVar2;
  size_t sVar3;
  
  if (((symbol->super_type).m_initialized == false) || ((symbol->super_type).m_storage == true)) {
    psVar2 = (state_base_t *)operator_new(0x10);
    psVar2->_vptr_state_base_t = (_func_int **)&PTR_process_00118c00;
    psVar2[1]._vptr_state_base_t = (_func_int **)0x0;
  }
  else {
    sVar3 = this->cnt + 1;
    this->cnt = sVar3;
    if (sVar3 != 4) {
      return;
    }
    psVar2 = (state_base_t *)operator_new(0x30);
    psVar2->_vptr_state_base_t = (_func_int **)&PTR_process_00118cf0;
    psVar2[1]._vptr_state_base_t = (_func_int **)0x0;
    psVar2[2]._vptr_state_base_t = (_func_int **)0x0;
    psVar2[3]._vptr_state_base_t = (_func_int **)0x0;
    psVar2[4]._vptr_state_base_t = (_func_int **)0x0;
    psVar2[5]._vptr_state_base_t = (_func_int **)0x0;
  }
  psVar1 = (ctx->current_state_m)._M_t.
           super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
           .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
           _M_head_impl;
  (ctx->current_state_m)._M_t.
  super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
  _M_head_impl = psVar2;
  if (psVar1 == (state_base_t *)0x0) {
    return;
  }
  operator_delete(psVar1);
  return;
}

Assistant:

void
start_of_frame_0_t::process(symbol_sm_t& ctx,
                            const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        ctx.state(
          std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else if (*symbol)
    {
        ctx.state(
          std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else if (++cnt == 4) // we expect four consecutive '0'
    {
        ctx.state(std::unique_ptr<payload_t>(new payload_t()));
    }
}